

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::drawForeground(QGraphicsView *this,QPainter *painter,QRectF *rect)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = *(long *)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
  if ((bVar2) && (*(int *)(*(long *)(lVar1 + 0x4e8) + 4) == 0)) {
    (**(code **)(**(long **)(lVar1 + 0x498) + 0xf0))(*(long **)(lVar1 + 0x498),painter,rect);
    return;
  }
  QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
  return;
}

Assistant:

void QGraphicsView::drawForeground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsView);
    if (d->scene && d->foregroundBrush.style() == Qt::NoBrush) {
        d->scene->drawForeground(painter, rect);
        return;
    }

    painter->fillRect(rect, d->foregroundBrush);
}